

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_mapper.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::number::impl::PropertiesAffixPatternProvider::getStringInternal
          (PropertiesAffixPatternProvider *this,int32_t flags)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = 8;
  if (((uint)flags >> 8 & 1) == 0) {
    uVar2 = (ulong)((flags & 0x200U) >> 2) | 0x48;
  }
  uVar1 = 0x88;
  if ((~flags & 0x300U) != 0) {
    uVar1 = uVar2;
  }
  return (UnicodeString *)
         ((long)&(this->super_AffixPatternProvider)._vptr_AffixPatternProvider + uVar1);
}

Assistant:

const UnicodeString& PropertiesAffixPatternProvider::getStringInternal(int32_t flags) const {
    bool prefix = (flags & AFFIX_PREFIX) != 0;
    bool negative = (flags & AFFIX_NEGATIVE_SUBPATTERN) != 0;
    if (prefix && negative) {
        return negPrefix;
    } else if (prefix) {
        return posPrefix;
    } else if (negative) {
        return negSuffix;
    } else {
        return posSuffix;
    }
}